

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O0

Type * __thiscall Type::MemberDataType(Type *this,ID *member_id)

{
  char *pcVar1;
  Type *pTVar2;
  long in_RDI;
  Type *t;
  FILE *in_stack_ffffffffffffffd0;
  Env *in_stack_ffffffffffffffd8;
  
  if (FLAGS_pac_debug) {
    in_stack_ffffffffffffffd0 = _stderr;
    in_stack_ffffffffffffffd8 = (Env *)ID::Name((ID *)0x150871);
    pcVar1 = ID::Name((ID *)0x150880);
    fprintf(in_stack_ffffffffffffffd0,"MemberDataType: %s::%s\n",in_stack_ffffffffffffffd8,pcVar1);
  }
  Env::set_allow_undefined_id(*(Env **)(in_RDI + 0x78),true);
  pTVar2 = Env::GetDataType(in_stack_ffffffffffffffd8,(ID *)in_stack_ffffffffffffffd0);
  Env::set_allow_undefined_id(*(Env **)(in_RDI + 0x78),false);
  return pTVar2;
}

Assistant:

Type* Type::MemberDataType(const ID* member_id) const
	{
	DEBUG_MSG("MemberDataType: %s::%s\n", type_decl_id_->Name(), member_id->Name());
	ASSERT(env_);
	env_->set_allow_undefined_id(true);
	Type* t = env_->GetDataType(member_id);
	env_->set_allow_undefined_id(false);
	return t;
	}